

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::VisitPrims
               (Stage *stage,VisitPrimFunction visitor_fun,void *userdata,string *err)

{
  ulong uVar1;
  bool bVar2;
  StageMetas *pSVar3;
  size_type sVar4;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *pvVar5;
  size_type sVar6;
  const_reference this;
  string *psVar7;
  const_reference pvVar8;
  pointer ppVar9;
  allocator local_349;
  string local_348;
  string local_328;
  undefined1 local_308 [8];
  Path root_abs_path_1;
  Prim *root;
  const_iterator __end3;
  const_iterator __begin3;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range3;
  string local_210 [32];
  fmt local_1f0 [32];
  uint local_1d0;
  allocator local_1c9;
  string local_1c8;
  string local_1a8;
  undefined1 local_188 [8];
  Path root_abs_path;
  _Self local_b0;
  iterator it;
  token nameTok;
  size_t i_1;
  const_reference local_70;
  ulong local_68;
  size_t i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  primNameTable;
  string *err_local;
  void *userdata_local;
  VisitPrimFunction visitor_fun_local;
  Stage *stage_local;
  
  primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  pSVar3 = Stage::metas(stage);
  sVar4 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pSVar3->primChildren);
  pvVar5 = Stage::root_prims(stage);
  sVar6 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size
                    ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)pvVar5);
  if (sVar4 == sVar6) {
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
           *)&i);
    local_68 = 0;
    while( true ) {
      uVar1 = local_68;
      pvVar5 = Stage::root_prims(stage);
      sVar4 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size
                        ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)pvVar5);
      if (sVar4 <= uVar1) break;
      pvVar5 = Stage::root_prims(stage);
      this = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                       (pvVar5,local_68);
      psVar7 = Prim::element_name_abi_cxx11_(this);
      pvVar5 = Stage::root_prims(stage);
      local_70 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                           (pvVar5,local_68);
      ::std::
      map<std::__cxx11::string,tinyusdz::Prim_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
      ::emplace<std::__cxx11::string_const&,tinyusdz::Prim_const*>
                ((map<std::__cxx11::string,tinyusdz::Prim_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                  *)&i,psVar7,&local_70);
      local_68 = local_68 + 1;
    }
    nameTok.str_.field_2._8_8_ = 0;
    while( true ) {
      pSVar3 = Stage::metas(stage);
      sVar4 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                        ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                         &pSVar3->primChildren);
      if (sVar4 <= (ulong)nameTok.str_.field_2._8_8_) break;
      pSVar3 = Stage::metas(stage);
      pvVar8 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                         (&pSVar3->primChildren,nameTok.str_.field_2._8_8_);
      Token::Token((Token *)&it,pvVar8);
      psVar7 = Token::str_abi_cxx11_((Token *)&it);
      local_b0._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                   *)&i,psVar7);
      root_abs_path._200_8_ =
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                  *)&i);
      bVar2 = ::std::operator!=(&local_b0,(_Self *)&root_abs_path._valid);
      if (bVar2) {
        Token::str_abi_cxx11_((Token *)&it);
        ::std::operator+((char *)&local_1a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x9de871);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_1c8,"",&local_1c9);
        Path::Path((Path *)local_188,&local_1a8,&local_1c8);
        ::std::__cxx11::string::~string((string *)&local_1c8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
        ::std::__cxx11::string::~string((string *)&local_1a8);
        ppVar9 = ::std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>
                 ::operator->(&local_b0);
        bVar2 = anon_unknown_6::VisitPrimsRec
                          ((Path *)local_188,ppVar9->second,0,visitor_fun,userdata,
                           (string *)primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count)
        ;
        if (!bVar2) {
          stage_local._7_1_ = 0;
        }
        local_1d0 = (uint)!bVar2;
        Path::~Path((Path *)local_188);
        if (local_1d0 == 0) {
          local_1d0 = 0;
        }
      }
      else {
        if (primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_210,
                     "Prim name `{}` in root Layer\'s `primChildren` metadatum not found in Layer root."
                     ,(allocator *)((long)&__range3 + 7));
          psVar7 = Token::str_abi_cxx11_((Token *)&it);
          fmt::format<std::__cxx11::string>
                    (local_1f0,(string *)local_210,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar7);
          ::std::__cxx11::string::operator+=
                    ((string *)primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_1f0);
          ::std::__cxx11::string::~string((string *)local_1f0);
          ::std::__cxx11::string::~string(local_210);
          ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
        }
        stage_local._7_1_ = 0;
        local_1d0 = 1;
      }
      Token::~Token((Token *)&it);
      if (local_1d0 != 0) goto LAB_007d5188;
      nameTok.str_.field_2._8_8_ = nameTok.str_.field_2._8_8_ + 1;
    }
    local_1d0 = 0;
LAB_007d5188:
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
            *)&i);
    if (local_1d0 != 0) goto LAB_007d5304;
  }
  else {
    pvVar5 = Stage::root_prims(stage);
    __end3._M_current =
         (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin
                           ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)pvVar5);
    root = (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end
                             ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)pvVar5);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                       *)&root), bVar2) {
      root_abs_path_1._200_8_ =
           __gnu_cxx::
           __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
           ::operator*(&__end3);
      Prim::element_name_abi_cxx11_((Prim *)root_abs_path_1._200_8_);
      ::std::operator+((char *)&local_328,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x9de871
                      );
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_348,"",&local_349);
      Path::Path((Path *)local_308,&local_328,&local_348);
      ::std::__cxx11::string::~string((string *)&local_348);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_349);
      ::std::__cxx11::string::~string((string *)&local_328);
      bVar2 = anon_unknown_6::VisitPrimsRec
                        ((Path *)local_308,(Prim *)root_abs_path_1._200_8_,0,visitor_fun,userdata,
                         (string *)primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (!bVar2) {
        stage_local._7_1_ = 0;
      }
      local_1d0 = (uint)!bVar2;
      Path::~Path((Path *)local_308);
      if (local_1d0 != 0) goto LAB_007d5304;
      __gnu_cxx::
      __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
      ::operator++(&__end3);
    }
  }
  stage_local._7_1_ = 1;
LAB_007d5304:
  return (bool)(stage_local._7_1_ & 1);
}

Assistant:

bool VisitPrims(const tinyusdz::Stage &stage, VisitPrimFunction visitor_fun,
                void *userdata, std::string *err) {
  // if `primChildren` is available, use it
  if (stage.metas().primChildren.size() == stage.root_prims().size()) {
    std::map<std::string, const Prim *> primNameTable;
    for (size_t i = 0; i < stage.root_prims().size(); i++) {
      primNameTable.emplace(stage.root_prims()[i].element_name(),
                            &stage.root_prims()[i]);
    }

    for (size_t i = 0; i < stage.metas().primChildren.size(); i++) {
      value::token nameTok = stage.metas().primChildren[i];
      const auto it = primNameTable.find(nameTok.str());
      if (it != primNameTable.end()) {
        const Path root_abs_path("/" + nameTok.str(), "");
        if (!VisitPrimsRec(root_abs_path, *it->second, 0, visitor_fun, userdata,
                           err)) {
          return false;
        }
      } else {
        if (err) {
          (*err) += fmt::format(
              "Prim name `{}` in root Layer's `primChildren` metadatum not "
              "found in Layer root.",
              nameTok.str());
        }
        return false;
      }
    }

  } else {
    for (const auto &root : stage.root_prims()) {
      const Path root_abs_path("/" + root.element_name(), /* prop part */ "");
      if (!VisitPrimsRec(root_abs_path, root, /* root level */ 0, visitor_fun,
                         userdata, err)) {
        return false;
      }
    }
  }

  return true;
}